

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_raiseException(sysbvm_tuple_t exception)

{
  sysbvm_context_t *context_00;
  FILE *__stream;
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  long *in_FS_OFFSET;
  sysbvm_stackFrameLandingPadRecord_t *local_48;
  sysbvm_stackFrameLandingPadRecord_t *landingPadRecord;
  sysbvm_tuple_t errorString;
  sysbvm_stackFrameLandingPadRecord_t *landingPadRecord_1;
  sysbvm_stackFrameRecord_t *stackFrameRecord;
  sysbvm_stackFrameRecord_t *exceptionRecord;
  sysbvm_context_t *context;
  sysbvm_tuple_t exception_local;
  
  context_00 = *(sysbvm_context_t **)(*in_FS_OFFSET + -0x18);
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    local_48 = *(sysbvm_stackFrameLandingPadRecord_t **)(*in_FS_OFFSET + -0x10);
  }
  else {
    local_48 = (sysbvm_stackFrameLandingPadRecord_t *)**(long **)(*in_FS_OFFSET + -8);
  }
  if (local_48 != (sysbvm_stackFrameLandingPadRecord_t *)0x0) {
    landingPadRecord_1 = local_48;
    while ((landingPadRecord_1 != (sysbvm_stackFrameLandingPadRecord_t *)0x0 &&
           ((landingPadRecord_1->type != SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD ||
            ((landingPadRecord_1->exceptionFilter != 0 &&
             (_Var1 = sysbvm_tuple_isKindOf
                                (context_00,exception,landingPadRecord_1->exceptionFilter), !_Var1))
            ))))) {
      landingPadRecord_1 = (sysbvm_stackFrameLandingPadRecord_t *)landingPadRecord_1->previous;
    }
    if (landingPadRecord_1 != (sysbvm_stackFrameLandingPadRecord_t *)0x0) {
      *(sysbvm_stackFrameLandingPadRecord_t **)(*in_FS_OFFSET + -8) = landingPadRecord_1;
      landingPadRecord_1->exception = exception;
      if (landingPadRecord_1->action != 0) {
        sVar2 = sysbvm_function_apply1
                          (context_00,landingPadRecord_1->action,landingPadRecord_1->exception);
        landingPadRecord_1->actionResult = sVar2;
      }
      if ((landingPadRecord_1->keepStackTrace & 1U) != 0) {
        sVar2 = sysbvm_stackFrame_buildStackTraceUpTo
                          ((sysbvm_stackFrameRecord_t *)landingPadRecord_1);
        landingPadRecord_1->stackTrace = sVar2;
      }
      *(undefined8 *)(*in_FS_OFFSET + -8) = 0;
      sysbvm_stackFrame_prepareUnwindingUntil((sysbvm_stackFrameRecord_t *)landingPadRecord_1);
      *(sysbvm_stackFrameLandingPadRecord_t **)(*in_FS_OFFSET + -0x10) = landingPadRecord_1;
      longjmp((__jmp_buf_tag *)landingPadRecord_1->jmpbuffer,1);
    }
    sVar2 = sysbvm_tuple_asString(context_00,exception);
    __stream = _stderr;
    sVar3 = sysbvm_tuple_getSizeInBytes(sVar2);
    fprintf(__stream,"Unhandled exception: %.*s\n",sVar3 & 0xffffffff,sVar2 + 0x10);
    sVar2 = sysbvm_stackFrame_buildStackTraceUpTo((sysbvm_stackFrameRecord_t *)0x0);
    sysbvm_stackFrame_printStackTrace(context_00,sVar2);
    abort();
  }
  fprintf(_stderr,"Cannot raise an exception without an active context.\n");
  abort();
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_raiseException(sysbvm_tuple_t exception)
{
    sysbvm_context_t *context = sysbvm_stackFrame_activeContext;
    sysbvm_stackFrameRecord_t *exceptionRecord = sysbvm_stackFrame_activeHandlerRecord ? sysbvm_stackFrame_activeHandlerRecord->previous : sysbvm_stackFrame_activeRecord;

    if(!exceptionRecord)
    {
        fprintf(stderr, "Cannot raise an exception without an active context.\n");
        abort();
    }


    // Find the landing pad record.
    sysbvm_stackFrameRecord_t *stackFrameRecord = exceptionRecord;
    while(stackFrameRecord)
    {
        if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD)
        {
            sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)stackFrameRecord;
            if(!landingPadRecord->exceptionFilter || sysbvm_tuple_isKindOf(context, exception, landingPadRecord->exceptionFilter))
                break;
        }
        stackFrameRecord = stackFrameRecord->previous;
    }

    // Did we find it?
    if(!stackFrameRecord)
    {
        sysbvm_tuple_t errorString = sysbvm_tuple_asString(context, exception);
        fprintf(stderr, "Unhandled exception: " SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(errorString));
        sysbvm_stackFrame_printStackTrace(context, sysbvm_stackFrame_buildStackTraceUpTo(NULL));
        abort();
    }

    // We found it, transfer the control flow onto it.
    sysbvm_stackFrame_activeHandlerRecord = stackFrameRecord;
    sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)stackFrameRecord;
    landingPadRecord->exception = exception;

    // Do we have an action on it?
    if(landingPadRecord->action)
    {
        // Invoke the action.
        landingPadRecord->actionResult = sysbvm_function_apply1(context, landingPadRecord->action, landingPadRecord->exception);
        exception = landingPadRecord->exception;
    }

    if(landingPadRecord->keepStackTrace)
        landingPadRecord->stackTrace = sysbvm_stackFrame_buildStackTraceUpTo((sysbvm_stackFrameRecord_t*)landingPadRecord);

    sysbvm_stackFrame_activeHandlerRecord = NULL;
    sysbvm_stackFrame_prepareUnwindingUntil((sysbvm_stackFrameRecord_t*)landingPadRecord);
    sysbvm_stackFrame_activeRecord = (sysbvm_stackFrameRecord_t*)landingPadRecord;
    longjmp(landingPadRecord->jmpbuffer, 1);
}